

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

matrix4d *
tinyusdz::trs_angle_xyz
          (matrix4d *__return_storage_ptr__,double3 *translation,double3 *rotation_angles_xyz,
          double3 *scale)

{
  bool bVar1;
  const_reference pvVar2;
  value_type *__src;
  matrix4d local_3d0;
  matrix4d local_350;
  undefined1 local_2d0 [8];
  matrix4d sMat;
  matrix4d tMat;
  matrix4d rMat;
  undefined1 local_148 [8];
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  XformEvaluator eval;
  double3 *scale_local;
  double3 *rotation_angles_xyz_local;
  double3 *translation_local;
  
  value::matrix4d::identity();
  anon_unknown_4::XformEvaluator::XformEvaluator
            ((XformEvaluator *)
             &ret.contained.
              super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value);
  pvVar2 = ::std::array<double,_3UL>::operator[](rotation_angles_xyz,0);
  anon_unknown_4::XformEvaluator::RotateX
            ((XformEvaluator *)
             &ret.contained.
              super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value,*pvVar2);
  pvVar2 = ::std::array<double,_3UL>::operator[](rotation_angles_xyz,1);
  anon_unknown_4::XformEvaluator::RotateY
            ((XformEvaluator *)
             &ret.contained.
              super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value,*pvVar2);
  pvVar2 = ::std::array<double,_3UL>::operator[](rotation_angles_xyz,2);
  anon_unknown_4::XformEvaluator::RotateZ
            ((XformEvaluator *)
             &ret.contained.
              super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value,*pvVar2);
  (anonymous_namespace)::XformEvaluator::result_abi_cxx11_
            ((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_148,
             &ret.contained.
              super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value);
  bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_148);
  if (bVar1) {
    __src = nonstd::expected_lite::
            expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::value((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_148);
    memcpy(tMat.m[3] + 3,__src,0x80);
    value::matrix4d::identity();
    pvVar2 = ::std::array<double,_3UL>::operator[](translation,0);
    tMat.m[2][3] = *pvVar2;
    pvVar2 = ::std::array<double,_3UL>::operator[](translation,1);
    tMat.m[3][0] = *pvVar2;
    pvVar2 = ::std::array<double,_3UL>::operator[](translation,2);
    tMat.m[3][1] = *pvVar2;
    value::matrix4d::identity();
    pvVar2 = ::std::array<double,_3UL>::operator[](scale,0);
    local_2d0 = (undefined1  [8])*pvVar2;
    pvVar2 = ::std::array<double,_3UL>::operator[](scale,1);
    sMat.m[1][0] = *pvVar2;
    pvVar2 = ::std::array<double,_3UL>::operator[](scale,2);
    sMat.m[2][1] = *pvVar2;
    value::operator*(&local_3d0,(matrix4d *)local_2d0,(matrix4d *)(tMat.m[3] + 3));
    value::operator*(&local_350,&local_3d0,(matrix4d *)(sMat.m[3] + 3));
    memcpy(__return_storage_ptr__,&local_350,0x80);
  }
  nonstd::expected_lite::
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~expected((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_148);
  anon_unknown_4::XformEvaluator::~XformEvaluator
            ((XformEvaluator *)
             &ret.contained.
              super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value);
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d trs_angle_xyz(const value::double3 &translation,
                              const value::double3 &rotation_angles_xyz,
                              const value::double3 &scale) {
  value::matrix4d m{value::matrix4d::identity()};

  XformEvaluator eval;
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
  eval.Rotation({1.0, 0.0, 0.0}, rotation_angles_xyz[0]);
  eval.Rotation({0.0, 1.0, 0.0}, rotation_angles_xyz[1]);
  eval.Rotation({0.0, 0.0, 1.0}, rotation_angles_xyz[2]);
#else
  eval.RotateX(rotation_angles_xyz[0]);
  eval.RotateY(rotation_angles_xyz[1]);
  eval.RotateZ(rotation_angles_xyz[2]);
#endif

  auto ret = eval.result();
  if (!ret) {
    // This should not happend though.
    return m;
  }
  value::matrix4d rMat = ret.value();

  value::matrix4d tMat{value::matrix4d::identity()};
  tMat.m[3][0] = translation[0];
  tMat.m[3][1] = translation[1];
  tMat.m[3][2] = translation[2];

  value::matrix4d sMat{value::matrix4d::identity()};
  sMat.m[0][0] = scale[0];
  sMat.m[1][1] = scale[1];
  sMat.m[2][2] = scale[2];

  m = sMat * rMat * tMat;

  return m;
}